

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

int compute_string_width_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  char *pcVar3;
  size_t sVar4;
  int local_80;
  int width;
  int str_len;
  Am_Object screen;
  Am_String local_28;
  Am_String string;
  Am_Font font;
  Am_Object *self_local;
  
  pAVar2 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font((Am_Font *)&string,pAVar2);
  pAVar2 = Am_Object::Get(self,0xab,0);
  Am_String::Am_String(&local_28,pAVar2);
  bVar1 = Am_String::Valid(&local_28);
  if (bVar1) {
    Am_GV_Screen((Am_Object *)&width);
    pcVar3 = Am_String::operator_cast_to_char_(&local_28);
    sVar4 = strlen(pcVar3);
    pcVar3 = Am_String::operator_cast_to_char_(&local_28);
    local_80 = Am_Get_String_Width((Am_Object *)&width,(Am_Font *)&string,pcVar3,(int)sVar4);
    if (local_80 < 0xb) {
      local_80 = 10;
    }
    self_local._4_4_ = local_80;
    Am_Object::~Am_Object((Am_Object *)&width);
  }
  else {
    self_local._4_4_ = 10;
  }
  Am_String::~Am_String(&local_28);
  Am_Font::~Am_Font((Am_Font *)&string);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, compute_string_width)
{
  Am_Font font(self.Get(Am_FONT));
  Am_String string(self.Get(Am_TEXT));

  if (string.Valid()) {
    Am_Object screen = Am_GV_Screen(self);
    int str_len = strlen(string);
    int width = Am_Get_String_Width(screen, font, string, str_len);

    // assure text boxes are always at least 10 pixels wide so you can click
    return width > 10 ? width : 10;
  } else
    return 10;
}